

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Image.cxx
# Opt level: O1

int __thiscall Fl_RGB_Image::copy(Fl_RGB_Image *this,int W,int H)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  bool bVar5;
  int iVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  int iVar10;
  uchar *src;
  long lVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  uchar *puVar18;
  uint uVar19;
  size_t __n;
  uint uVar20;
  float fVar21;
  undefined4 in_XMM1_Db;
  undefined4 uVar22;
  undefined4 in_XMM1_Dd;
  undefined4 in_XMM2_Db;
  undefined4 in_XMM2_Dc;
  undefined4 in_XMM2_Dd;
  uchar downright [4];
  uchar downleft [4];
  uchar right [4];
  uchar left [4];
  byte local_118 [4];
  byte local_114 [4];
  byte local_110 [4];
  byte local_10c [4];
  int local_108;
  int local_104;
  undefined8 *local_100;
  ulong local_f8;
  ulong local_f0;
  float local_e4;
  float local_e0;
  float local_dc;
  undefined8 local_d8;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  uchar *local_c8;
  ulong local_c0;
  ulong local_b8;
  ulong local_b0;
  uchar *local_a8;
  long local_a0;
  uchar *local_98;
  ulong local_90;
  float local_88;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  float local_68;
  undefined4 uStack_60;
  float local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  float local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  uVar22 = 0;
  iVar1 = (this->super_Fl_Image).w_;
  if (((iVar1 != 0) && ((this->super_Fl_Image).h_ != H || iVar1 != W)) &&
     (iVar2 = (this->super_Fl_Image).h_, iVar2 != 0)) {
    uVar3 = (this->super_Fl_Image).d_;
    __n = (size_t)(int)uVar3;
    if ((__n != 0) && (local_c8 = this->array, local_c8 != (uchar *)0x0)) {
      if (H < 1 || W < 1) {
        local_100 = (undefined8 *)0x0;
      }
      else {
        pvVar7 = operator_new__((long)(int)(H * W * uVar3));
        local_100 = (undefined8 *)operator_new(0x40);
        *(int *)(local_100 + 1) = W;
        *(int *)((long)local_100 + 0xc) = H;
        *(uint *)(local_100 + 2) = uVar3;
        *(undefined8 *)((long)local_100 + 0x14) = 0;
        *local_100 = &PTR__Fl_RGB_Image_00278218;
        local_100[5] = pvVar7;
        *(undefined4 *)(local_100 + 7) = 0;
        local_100[4] = local_100 + 5;
        *(undefined4 *)(local_100 + 3) = 1;
        local_100[6] = 1;
        iVar17 = (this->super_Fl_Image).ld_;
        local_104 = uVar3 * iVar1;
        if (iVar17 != 0) {
          local_104 = iVar17;
        }
        if (Fl_Image::RGB_scaling_ == FL_RGB_SCALING_NEAREST) {
          iVar13 = 0;
          iVar17 = H;
          iVar16 = H;
          do {
            puVar18 = this->array + iVar13 * local_104;
            iVar10 = W;
            iVar15 = W;
            do {
              iVar12 = (this->super_Fl_Image).d_;
              if (0 < iVar12) {
                lVar11 = 0;
                do {
                  *(uchar *)((long)pvVar7 + lVar11) = puVar18[lVar11];
                  lVar11 = lVar11 + 1;
                  iVar12 = (this->super_Fl_Image).d_;
                } while (lVar11 < iVar12);
                pvVar7 = (void *)((long)pvVar7 + lVar11);
              }
              iVar10 = iVar10 - iVar1 % W;
              iVar6 = W;
              if (0 < iVar10) {
                iVar12 = 0;
                iVar6 = 0;
              }
              iVar10 = iVar10 + iVar6;
              puVar18 = puVar18 + (long)iVar12 + (long)(int)((iVar1 / W) * uVar3);
              bVar5 = 1 < iVar15;
              iVar15 = iVar15 + -1;
            } while (bVar5);
            iVar15 = iVar16 - iVar2 % H;
            iVar16 = 0;
            if (iVar15 < 1) {
              iVar16 = H;
            }
            iVar16 = iVar15 + iVar16;
            iVar13 = iVar13 + iVar2 / H + (uint)(iVar15 < 1);
            bVar5 = 1 < iVar17;
            iVar17 = iVar17 + -1;
          } while (bVar5);
        }
        else if (0 < H) {
          local_b8 = (ulong)uVar3;
          local_58 = (float)(iVar1 + -1);
          local_78 = (float)(iVar2 + -1);
          local_68 = local_58 / (float)W;
          local_e4 = (float)iVar2;
          local_88 = local_78 / (float)H;
          local_e0 = (float)iVar1;
          local_108 = uVar3 * W;
          local_c0 = (ulong)(uint)H;
          local_b0 = (ulong)(uint)W;
          local_f0 = 0;
          local_f8 = 0;
          uStack_74 = in_XMM2_Db;
          uStack_70 = in_XMM2_Dc;
          uStack_6c = in_XMM2_Dd;
          uStack_60 = uVar22;
          uStack_54 = in_XMM1_Db;
          uStack_50 = uVar22;
          uStack_4c = in_XMM1_Dd;
          do {
            if (0 < W) {
              fVar21 = (float)(int)local_f8 * local_88;
              uVar20 = -(uint)(fVar21 < local_e4);
              fVar21 = (float)(~uVar20 & (uint)local_78 | (uint)fVar21 & uVar20);
              lVar11 = (long)(int)local_f0 + (long)pvVar7;
              uVar20 = -(uint)(local_e4 <= fVar21 + 1.0);
              local_48 = fVar21 - (float)((long)fVar21 & 0xffffffff);
              local_a0 = (long)(local_108 * (int)local_f8) + (long)pvVar7;
              local_98 = local_c8 + (uint)((int)(long)fVar21 * local_104);
              local_a8 = local_c8 +
                         (uint)((int)(long)(float)(uVar20 & (uint)fVar21 |
                                                  ~uVar20 & (uint)(fVar21 + 1.0)) * local_104);
              local_dc = 1.0 - local_48;
              uVar14 = 0;
              uStack_44 = uStack_74;
              uStack_40 = uStack_70;
              uStack_3c = uStack_6c;
              do {
                puVar18 = local_98;
                fVar21 = (float)(int)uVar14 * local_68;
                uVar20 = -(uint)(fVar21 < local_e0);
                fVar21 = (float)(~uVar20 & (uint)local_58 | (uint)fVar21 & uVar20);
                local_90 = (ulong)fVar21;
                uVar20 = -(uint)(local_e0 <= fVar21 + 1.0);
                local_d8 = (void *)CONCAT44(uStack_54,fVar21);
                uStack_d0 = uStack_50;
                uStack_cc = uStack_4c;
                uVar19 = uVar3 * (int)local_90;
                memcpy(local_10c,local_98 + uVar19,__n);
                uVar20 = (int)(long)(float)(~uVar20 & (uint)(fVar21 + 1.0) | uVar20 & (uint)fVar21)
                         * uVar3;
                memcpy(local_110,puVar18 + uVar20,__n);
                puVar18 = local_a8;
                memcpy(local_114,local_a8 + uVar19,__n);
                memcpy(local_118,puVar18 + uVar20,__n);
                if (uVar3 == 4) {
                  lVar8 = 0;
                  do {
                    local_10c[lVar8] =
                         (byte)(int)((float)((uint)local_10c[3] * (uint)local_10c[lVar8]) / 255.0);
                    local_110[lVar8] =
                         (byte)(int)((float)((uint)local_110[3] * (uint)local_110[lVar8]) / 255.0);
                    local_114[lVar8] =
                         (byte)(int)((float)((uint)local_114[3] * (uint)local_114[lVar8]) / 255.0);
                    local_118[lVar8] =
                         (byte)(int)((float)((uint)local_118[3] * (uint)local_118[lVar8]) / 255.0);
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 3);
                }
                if (0 < (int)uVar3) {
                  local_d8._0_4_ = (float)local_d8 - (float)(local_90 & 0xffffffff);
                  uVar9 = 0;
                  do {
                    *(char *)(lVar11 + uVar9) =
                         (char)(int)(((float)local_114[uVar9] * (1.0 - (float)local_d8) +
                                     (float)local_118[uVar9] * (float)local_d8) * local_48 +
                                    ((float)local_10c[uVar9] * (1.0 - (float)local_d8) +
                                    (float)local_110[uVar9] * (float)local_d8) * local_dc);
                    uVar9 = uVar9 + 1;
                  } while (local_b8 != uVar9);
                }
                if ((uVar3 == 4) && (*(char *)(local_a0 + 3 + uVar14 * __n) != '\0')) {
                  lVar8 = 0;
                  do {
                    *(char *)(lVar11 + lVar8) =
                         (char)(int)((float)*(byte *)(lVar11 + lVar8) /
                                    ((float)*(byte *)(local_a0 + 3 + uVar14 * __n) / 255.0));
                    lVar8 = lVar8 + 1;
                  } while (lVar8 != 3);
                }
                uVar14 = uVar14 + 1;
                lVar11 = lVar11 + __n;
              } while (uVar14 != local_b0);
            }
            local_f8 = local_f8 + 1;
            local_f0 = (ulong)(uint)((int)local_f0 + local_108);
          } while (local_f8 != local_c0);
        }
      }
      goto LAB_001b7ec1;
    }
  }
  puVar18 = this->array;
  if (puVar18 == (uchar *)0x0) {
    local_100 = (undefined8 *)operator_new(0x40);
    uVar4 = *(undefined8 *)&(this->super_Fl_Image).h_;
    iVar2 = (this->super_Fl_Image).ld_;
    *(int *)(local_100 + 1) = iVar1;
    *(undefined8 *)((long)local_100 + 0xc) = uVar4;
    *local_100 = &PTR__Fl_RGB_Image_00278218;
    local_100[5] = 0;
    local_100[6] = 0;
    *(undefined4 *)(local_100 + 7) = 0;
    local_100[4] = local_100 + 5;
    *(undefined4 *)(local_100 + 3) = 1;
    *(int *)((long)local_100 + 0x14) = iVar2;
  }
  else {
    iVar2 = (this->super_Fl_Image).h_;
    iVar17 = (this->super_Fl_Image).d_;
    iVar13 = iVar17 * iVar1;
    pvVar7 = operator_new__((long)(iVar13 * iVar2));
    iVar16 = (this->super_Fl_Image).ld_;
    local_d8 = pvVar7;
    if (((long)iVar16 == 0) || (iVar16 == iVar13)) {
      memcpy(pvVar7,puVar18,(long)(iVar13 * iVar2));
    }
    else if (0 < iVar2) {
      iVar15 = iVar2;
      do {
        memcpy(pvVar7,puVar18,(long)iVar13);
        puVar18 = puVar18 + iVar16;
        pvVar7 = (void *)((long)pvVar7 + (long)iVar13);
        iVar15 = iVar15 + -1;
      } while (iVar15 != 0);
    }
    local_100 = (undefined8 *)operator_new(0x40);
    *(int *)(local_100 + 1) = iVar1;
    *(int *)((long)local_100 + 0xc) = iVar2;
    *(int *)(local_100 + 2) = iVar17;
    *(undefined8 *)((long)local_100 + 0x14) = 0;
    *local_100 = &PTR__Fl_RGB_Image_00278218;
    local_100[5] = local_d8;
    *(undefined4 *)(local_100 + 7) = 0;
    local_100[4] = local_100 + 5;
    *(undefined4 *)(local_100 + 3) = 1;
    local_100[6] = 1;
  }
LAB_001b7ec1:
  return (int)local_100;
}

Assistant:

Fl_Image *Fl_RGB_Image::copy(int W, int H) {
  Fl_RGB_Image	*new_image;	// New RGB image
  uchar		*new_array;	// New array for image data

  // Optimize the simple copy where the width and height are the same,
  // or when we are copying an empty image...
  if ((W == w() && H == h()) ||
      !w() || !h() || !d() || !array) {
    if (array) {
      // Make a copy of the image data and return a new Fl_RGB_Image...
      new_array = new uchar[w() * h() * d()];
      if (ld() && ld()!=w()*d()) {
        const uchar *src = array;
        uchar *dst = new_array;
        int dy, dh = h(), wd = w()*d(), wld = ld();
        for (dy=0; dy<dh; dy++) {
          memcpy(dst, src, wd);
          src += wld;
          dst += wd;
        }
      } else {
        memcpy(new_array, array, w() * h() * d());
      }
      new_image = new Fl_RGB_Image(new_array, w(), h(), d());
      new_image->alloc_array = 1;

      return new_image;
    } else {
      return new Fl_RGB_Image(array, w(), h(), d(), ld());
    }
  }
  if (W <= 0 || H <= 0) return 0;

  // OK, need to resize the image data; allocate memory and create new image
  uchar		*new_ptr;	// Pointer into new array
  const uchar	*old_ptr;	// Pointer into old array
  int		dx, dy,		// Destination coordinates
		line_d;		// stride from line to line

  // Allocate memory for the new image...
  new_array = new uchar [W * H * d()];
  new_image = new Fl_RGB_Image(new_array, W, H, d());
  new_image->alloc_array = 1;

  line_d = ld() ? ld() : w() * d();

  if (Fl_Image::RGB_scaling() == FL_RGB_SCALING_NEAREST) {

    int		c,		// Channel number
		sy,		// Source coordinate
		xerr, yerr,	// X & Y errors
		xmod, ymod,	// X & Y moduli
		xstep, ystep;	// X & Y step increments

    // Figure out Bresenham step/modulus values...
    xmod   = w() % W;
    xstep  = (w() / W) * d();
    ymod   = h() % H;
    ystep  = h() / H;

    // Scale the image using a nearest-neighbor algorithm...
    for (dy = H, sy = 0, yerr = H, new_ptr = new_array; dy > 0; dy --) {
      for (dx = W, xerr = W, old_ptr = array + sy * line_d; dx > 0; dx --) {
        for (c = 0; c < d(); c ++) *new_ptr++ = old_ptr[c];

        old_ptr += xstep;
        xerr    -= xmod;

        if (xerr <= 0) {
          xerr    += W;
	  old_ptr += d();
        }
      }

      sy   += ystep;
      yerr -= ymod;
      if (yerr <= 0) {
        yerr += H;
        sy ++;
      }
    }
  } else {
    // Bilinear scaling (FL_RGB_SCALING_BILINEAR)
    const float xscale = (w() - 1) / (float) W;
    const float yscale = (h() - 1) / (float) H;
    for (dy = 0; dy < H; dy++) {
      float oldy = dy * yscale;
      if (oldy >= h())
        oldy = float(h() - 1);
      const float yfract = oldy - (unsigned) oldy;

      for (dx = 0; dx < W; dx++) {
        new_ptr = new_array + dy * W * d() + dx * d();

        float oldx = dx * xscale;
        if (oldx >= w())
          oldx = float(w() - 1);
        const float xfract = oldx - (unsigned) oldx;

        const unsigned leftx = (unsigned)oldx;
        const unsigned lefty = (unsigned)oldy;
        const unsigned rightx = (unsigned)(oldx + 1 >= w() ? oldx : oldx + 1);
        const unsigned righty = (unsigned)oldy;
        const unsigned dleftx = (unsigned)oldx;
        const unsigned dlefty = (unsigned)(oldy + 1 >= h() ? oldy : oldy + 1);
        const unsigned drightx = (unsigned)rightx;
        const unsigned drighty = (unsigned)dlefty;

        uchar left[4], right[4], downleft[4], downright[4];
        memcpy(left, array + lefty * line_d + leftx * d(), d());
        memcpy(right, array + righty * line_d + rightx * d(), d());
        memcpy(downleft, array + dlefty * line_d + dleftx * d(), d());
        memcpy(downright, array + drighty * line_d + drightx * d(), d());

        int i;
        if (d() == 4) {
          for (i = 0; i < 3; i++) {
            left[i] = (uchar)(left[i] * left[3] / 255.0f);
            right[i] = (uchar)(right[i] * right[3] / 255.0f);
            downleft[i] = (uchar)(downleft[i] * downleft[3] / 255.0f);
            downright[i] = (uchar)(downright[i] * downright[3] / 255.0f);
          }
        }

	const float leftf = 1 - xfract;
	const float rightf = xfract;
	const float upf = 1 - yfract;
	const float downf = yfract;

        for (i = 0; i < d(); i++) {
          new_ptr[i] = (uchar)((left[i] * leftf +
                   right[i] * rightf) * upf +
                   (downleft[i] * leftf +
                   downright[i] * rightf) * downf);
        }

        if (d() == 4 && new_ptr[3]) {
          for (i = 0; i < 3; i++) {
            new_ptr[i] = (uchar)(new_ptr[i] / (new_ptr[3] / 255.0f));
          }
        }
      }
    }
  }

  return new_image;
}